

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_first_unused_segment_const(void)

{
  initializer_list<int> __l;
  const_segment cVar1;
  vector<int,_std::allocator<int>_> expect;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> local_68;
  int local_50 [2];
  type local_48 [4];
  circular_view<int,_18446744073709551615UL> local_38;
  
  local_38.member.data = local_48;
  local_48[0] = 0xb;
  local_48[1] = 0x16;
  local_48[2] = 0;
  local_48[3] = 0;
  local_38.member.cap = 4;
  local_38.member.size = 2;
  local_38.member.next = 2;
  cVar1 = vista::circular_view<int,_18446744073709551615UL>::first_unused_segment(&local_38);
  local_50[0] = 0;
  local_50[1] = 0;
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l,&local_69);
  boost::detail::
  test_all_eq_impl<std::ostream,int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x23c,"void api_dynamic_suite::dynamic_first_unused_segment_const()",cVar1.member.head
             ,cVar1.member.tail,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dynamic_first_unused_segment_const()
{
    std::array<int, 4> array = { 11, 22 };
    const circular_view<int> span(array.begin(), array.end(), array.begin(), 2);
    auto segment = span.first_unused_segment();
    {
        std::vector<int> expect = { 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}